

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.cc
# Opt level: O2

void __thiscall
QPDFNameTreeObjectHelper::Members::Members
          (Members *this,QPDFObjectHandle *oh,QPDF *q,bool auto_repair)

{
  pointer p_Var1;
  __allocator_type __a2;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<NNTreeImpl,_std::allocator<NNTreeImpl>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_40;
  
  (this->impl).super___shared_ptr<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var1 = std::
           allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<NNTreeImpl,_std::allocator<NNTreeImpl>,_(__gnu_cxx::_Lock_policy)2>_>_>
           ::allocate(&__a2,1);
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_002af780;
  local_40._M_alloc = &__a2;
  local_40._M_ptr = p_Var1;
  NNTreeImpl::NNTreeImpl
            ((NNTreeImpl *)&p_Var1->_M_impl,&name_tree_details.super_NNTreeDetails,q,oh,auto_repair)
  ;
  local_40._M_ptr = (pointer)0x0;
  (this->impl).super___shared_ptr<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       &p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
  (this->impl).super___shared_ptr<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&p_Var1->_M_impl;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<NNTreeImpl,_std::allocator<NNTreeImpl>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_40);
  return;
}

Assistant:

QPDFNameTreeObjectHelper::Members::Members(QPDFObjectHandle& oh, QPDF& q, bool auto_repair) :
    impl(std::make_shared<NNTreeImpl>(name_tree_details, q, oh, auto_repair))
{
}